

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O2

string * StringBuilder<int,char_const(&)[10]>
                   (string *__return_storage_ptr__,int *arg,char (*args) [10])

{
  string local_50;
  string local_30;
  
  StringBuilder<int>(&local_30,arg);
  StringBuilder_abi_cxx11_(&local_50,*args);
  std::operator+(__return_storage_ptr__,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}